

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall embree::TokenStream::tryInt(TokenStream *this,Token *token,ParseLocation *loc)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  string str;
  string local_98;
  undefined4 local_78;
  int iStack_74;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  ssize_t local_40;
  ssize_t sStack_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  bVar3 = decDigits(this,&local_98);
  if (bVar3) {
    iStack_74 = atoi(local_98._M_dataplus._M_p);
    local_78 = 2;
    local_68 = 0;
    local_60[0] = 0;
    local_50 = (loc->fileName).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_48 = (loc->fileName).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_48->_M_use_count = p_Stack_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_48->_M_use_count = p_Stack_48->_M_use_count + 1;
      }
    }
    local_40 = loc->lineNumber;
    sStack_38 = loc->colNumber;
    token->ty = 2;
    token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)iStack_74;
    local_70 = local_60;
    std::__cxx11::string::operator=((string *)&token->str,(string *)&local_70);
    p_Var2 = p_Stack_48;
    peVar1 = local_50;
    local_50 = (element_type *)0x0;
    p_Stack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (token->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (token->loc).lineNumber = local_40;
    (token->loc).colNumber = sStack_38;
    if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_48);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool TokenStream::tryInt(Token& token, const ParseLocation& loc) {
    std::string str;
    if (decDigits(str)) {
      token = Token(atoi(str.c_str()),loc);
      return true;
    }
    return false;
  }